

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesAlbum.cpp
# Opt level: O0

void __thiscall ResourcesAlbum::clearLeafsContent(ResourcesAlbum *this)

{
  bool bVar1;
  pointer ppVar2;
  ResourceContentWrapper *cw;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_> local_18;
  iterator itr;
  ResourcesAlbum *this_local;
  
  itr._M_node = (_Base_ptr)this;
  std::_Rb_tree_iterator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>::
  _Rb_tree_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<ResourceLeafWrapper_*,_ResourceContentWrapper_*,_std::less<ResourceLeafWrapper_*>,_std::allocator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>_>
             ::begin(&this->leafToContentWrapper);
  local_18._M_node = local_20;
  while( true ) {
    cw = (ResourceContentWrapper *)
         std::
         map<ResourceLeafWrapper_*,_ResourceContentWrapper_*,_std::less<ResourceLeafWrapper_*>,_std::allocator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>_>
         ::end(&this->leafToContentWrapper);
    bVar1 = std::operator!=(&local_18,(_Self *)&cw);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>::
             operator->(&local_18);
    if (ppVar2->second != (ResourceContentWrapper *)0x0) {
      (*(ppVar2->second->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
        _vptr_AbstractByteBuffer[1])();
    }
    std::_Rb_tree_iterator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>::
    operator++(&local_18);
  }
  std::
  map<ResourceLeafWrapper_*,_ResourceContentWrapper_*,_std::less<ResourceLeafWrapper_*>,_std::allocator<std::pair<ResourceLeafWrapper_*const,_ResourceContentWrapper_*>_>_>
  ::clear(&this->leafToContentWrapper);
  return;
}

Assistant:

void ResourcesAlbum::clearLeafsContent()
{
    std::map<ResourceLeafWrapper*, ResourceContentWrapper*>::iterator itr;
    for (itr = leafToContentWrapper.begin(); itr != leafToContentWrapper.end(); ++itr) {
        ResourceContentWrapper* cw = itr->second;
        delete cw;
    }
    leafToContentWrapper.clear();
}